

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.hpp
# Opt level: O1

void __thiscall deqp::gls::ShaderExecUtil::Symbol::Symbol(Symbol *this)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  glu::VarType::VarType(&this->varType);
  return;
}

Assistant:

Symbol (void) {}